

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servls.cpp
# Opt level: O1

int32_t __thiscall icu_63::ServiceEnumeration::count(ServiceEnumeration *this,UErrorCode *status)

{
  int iVar1;
  bool bVar2;
  int32_t iVar3;
  
  bVar2 = true;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar1 = this->_timestamp;
    iVar3 = ICUService::getTimestamp(&this->_service->super_ICUService);
    if (iVar1 == iVar3) {
      bVar2 = false;
    }
    else {
      *status = U_ENUM_OUT_OF_SYNC_ERROR;
    }
  }
  iVar3 = 0;
  if (!bVar2) {
    iVar3 = (this->_ids).count;
  }
  return iVar3;
}

Assistant:

virtual int32_t count(UErrorCode& status) const {
        return upToDate(status) ? _ids.size() : 0;
    }